

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Izhikevich.cpp
# Opt level: O2

Event * __thiscall Izhikevich::update(Izhikevich *this,double n_dt)

{
  Izhikevich_param *pIVar1;
  SpikeEvent *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  this->dt = n_dt;
  dVar4 = this->v;
  dVar2 = this->u;
  dVar3 = ((dVar4 * 0.04 * dVar4 + dVar4 * 5.0 + 140.0) - dVar2) + this->input_current;
  this->dv = dVar3;
  dVar5 = (this->param->b * dVar4 - dVar2) * this->param->a;
  this->du = dVar5;
  dVar4 = dVar3 * n_dt + this->input_spike + dVar4;
  this->u = dVar5 * n_dt + dVar2;
  dVar2 = -1.79769313486232e+308;
  if (-1.79769313486232e+308 <= dVar4) {
    dVar2 = dVar4;
  }
  this->v = dVar2;
  Logging::logValue((this->super_Neuron).logger,(this->super_Neuron).populationID,
                    (this->super_Neuron).neuronID,0,dVar2);
  (*(this->super_Neuron)._vptr_Neuron[2])(this);
  pIVar1 = this->param;
  if (this->v < pIVar1->v_thres || this->v == pIVar1->v_thres) {
    this_00 = (SpikeEvent *)operator_new(0x18);
    NoEvent::NoEvent((NoEvent *)this_00);
  }
  else {
    this->v = pIVar1->c;
    this->u = pIVar1->d + this->u;
    this_00 = (SpikeEvent *)operator_new(0x28);
    SpikeEvent::SpikeEvent(this_00);
  }
  return &this_00->super_Event;
}

Assistant:

Event* Izhikevich::update(double n_dt) {
    dt = n_dt;
    
    dv = 0.04*v*v + 5*v + 140 - u + input_current;
    du = param->a*(param->b*v - u);

    v += dv * dt + input_spike;
    u += du * dt;

    v = ( v < -std::numeric_limits< double >::max() ? -std::numeric_limits< double >::max() : v );

    logger->logValue(populationID, neuronID, ValueType::voltage, v);

    resetInput();

    if(v > param->v_thres) {
        v = param->c;
        u += param->d;
        return new SpikeEvent();
    }

    return new NoEvent();
}